

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateEnumStub
          (PythonStubGenerator *this,stringstream *stub,EnumDef *enum_def,Imports *imports)

{
  pointer ppEVar1;
  EnumVal *pEVar2;
  Imports *imports_00;
  PythonStubGenerator *this_00;
  ostream *poVar3;
  BaseType type;
  char *pcVar4;
  pointer ppEVar5;
  allocator<char> local_b9;
  EnumDef *local_b8;
  ostream *local_b0;
  string local_a8;
  string local_88;
  IdlNamer *local_68;
  Imports *local_60;
  PythonStubGenerator *local_58;
  string local_50;
  
  local_b0 = (ostream *)(stub + 0x10);
  poVar3 = std::operator<<(local_b0,"class ");
  local_68 = &this->namer_;
  local_b8 = enum_def;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_a8,local_68,enum_def);
  std::operator<<(poVar3,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_60 = imports;
  local_58 = this;
  if ((this->version_).major == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"enum",(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"IntEnum",&local_b9);
    Imports::Import(imports,&local_a8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar4 = "(IntEnum)";
  }
  else {
    pcVar4 = "(object)";
  }
  poVar3 = local_b0;
  std::operator<<(local_b0,pcVar4);
  std::operator<<(poVar3,":\n");
  ppEVar1 = (local_b8->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar5 = (local_b8->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 = local_58, ppEVar5 != ppEVar1;
      ppEVar5 = ppEVar5 + 1) {
    pEVar2 = *ppEVar5;
    poVar3 = std::operator<<(local_b0,"  ");
    (*(local_68->super_Namer)._vptr_Namer[0x13])(&local_a8,local_68,pEVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_a8);
    poVar3 = std::operator<<(poVar3,": ");
    (anonymous_namespace)::PythonStubGenerator::ScalarType_abi_cxx11_
              (&local_88,(PythonStubGenerator *)(ulong)(local_b8->underlying_type).base_type,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_88);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if (((local_58->parser_->opts).generate_object_based_api & local_b8->is_union) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"flatbuffers",(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"table",&local_b9);
    imports_00 = local_60;
    Imports::Import(local_60,&local_a8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    poVar3 = std::operator<<(local_b0,"def ");
    (*(local_68->super_Namer)._vptr_Namer[6])(&local_a8,local_68,local_b8);
    poVar3 = std::operator<<(poVar3,(string *)&local_a8);
    poVar3 = std::operator<<(poVar3,"Creator(union_type: ");
    (anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
              (&local_88,(PythonStubGenerator *)this_00,local_b8,imports_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_88);
    poVar3 = std::operator<<(poVar3,", table: table.Table) -> ");
    (anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
              (&local_50,(PythonStubGenerator *)this_00,local_b8,imports_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,": ...\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void GenerateEnumStub(std::stringstream &stub, const EnumDef *enum_def,
                        Imports *imports) const {
    stub << "class " << namer_.Type(*enum_def);

    if (version_.major == 3){
      imports->Import("enum", "IntEnum");
      stub << "(IntEnum)";
    }
    else {
      stub << "(object)";
    }

    stub << ":\n";
    for (const EnumVal *val : enum_def->Vals()) {
      stub << "  " << namer_.Variant(*val) << ": "
           << ScalarType(enum_def->underlying_type.base_type) << "\n";
    }

    if (parser_.opts.generate_object_based_api & enum_def->is_union) {
      imports->Import("flatbuffers", "table");
      stub << "def " << namer_.Function(*enum_def)
           << "Creator(union_type: " << EnumType(*enum_def, imports)
           << ", table: table.Table) -> " << UnionType(*enum_def, imports)
           << ": ...\n";
    }
  }